

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  size_t in_RCX;
  void *in_RDX;
  char_spec_handler *this_local;
  
  if (this->formatter->specs_ == (format_specs *)0x0) {
    write(this->formatter,(int)this->value,in_RDX,in_RCX);
  }
  else {
    write_int<int>(this->formatter,(int)this->value,this->formatter->specs_);
  }
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.write_int(static_cast<int>(value), *formatter.specs_);
      else
        formatter.write(value);
    }